

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::init(SRGBTestCase *this,EVP_PKEY_CTX *ctx)

{
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data;
  bool bVar1;
  deUint32 dVar2;
  int extraout_EAX;
  ContextInfo *pCVar3;
  NotSupportedError *pNVar4;
  MovePtr *this_00;
  RenderContext *context;
  TypedObjectWrapper<(glu::ObjectType)3> *in_stack_ffffffffffffff08;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  *__return_storage_ptr__;
  DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_> local_a1;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  local_a0;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  *local_90;
  undefined1 local_7a;
  allocator<char> local_79;
  string local_78;
  TextureFormat local_58;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  TextureFormat local_18;
  SRGBTestCase *local_10;
  SRGBTestCase *this_local;
  
  local_18 = this->m_internalFormat;
  local_10 = this;
  dVar2 = glu::getInternalFormat(local_18);
  if (dVar2 == 0x8c43) {
    pCVar3 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_EXT_texture_sRGB_decode");
    if (!bVar1) {
      local_4d = 1;
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Test requires GL_EXT_texture_sRGB_decode extension",&local_39)
      ;
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_38);
      local_4d = 0;
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  local_58 = this->m_internalFormat;
  dVar2 = glu::getInternalFormat(local_58);
  if (dVar2 == 0x8fbd) {
    pCVar3 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_EXT_texture_sRGB_R8");
    if (!bVar1) {
      local_7a = 1;
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Test requires GL_EXT_texture_sRGB_R8 extension",&local_79);
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_78);
      local_7a = 0;
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_00 = (MovePtr *)operator_new(0x18);
  context = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)this_00,context);
  de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>::DefaultDeleter(&local_a1);
  __return_storage_ptr__ = &local_a0;
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::MovePtr();
  local_90 = de::details::MovePtr::operator_cast_to_PtrData(__return_storage_ptr__,this_00);
  data._8_8_ = __return_storage_ptr__;
  data.ptr = in_stack_ffffffffffffff08;
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::operator=(&this->m_framebuffer,data);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
              *)&local_a0);
  return extraout_EAX;
}

Assistant:

void SRGBTestCase::init (void)
{
	// extension requirements for test
	if ( (glu::getInternalFormat(m_internalFormat) == GL_SRGB8_ALPHA8) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_sRGB_decode") )
	{
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_sRGB_decode extension");
	}

	if ( (glu::getInternalFormat(m_internalFormat) == GL_SR8_EXT) && !(m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_sRGB_R8")) )
	{
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_sRGB_R8 extension");
	}

	m_framebuffer = de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(m_context.getRenderContext()));
}